

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  (*gl3wProcs.ptr[0x96])(0xbe2);
  (*gl3wProcs.ptr[0x1e])(0x8006);
  (*gl3wProcs.ptr[0x22])(0x302,0x303);
  (*gl3wProcs.ptr[0x7d])(0xb44);
  (*gl3wProcs.ptr[0x7d])(0xb71);
  (*gl3wProcs.ptr[0x96])(0xc11);
  (*gl3wProcs.ptr[0x176])(0x408,0x1b02);
  (*gl3wProcs.ptr[0x28c])(0,0,(ulong)(uint)fb_width,(ulong)(uint)fb_height);
  fVar2 = (draw_data->DisplayPos).x;
  fVar3 = (draw_data->DisplayPos).y;
  fVar4 = (draw_data->DisplaySize).x + fVar2;
  fVar5 = (draw_data->DisplaySize).y + fVar3;
  auVar6._0_4_ = fVar2 + fVar4;
  auVar6._4_4_ = fVar3 + fVar5;
  auVar6._8_8_ = 0;
  auVar1._4_4_ = fVar5 - fVar3;
  auVar1._0_4_ = fVar2 - fVar4;
  auVar1._8_8_ = 0;
  divps(auVar6,auVar1);
  (*gl3wProcs.ptr[0x22f])((ulong)g_ShaderHandle);
  (*gl3wProcs.ptr[0x1fd])((ulong)(uint)g_AttribLocationTex,0);
  (*gl3wProcs.ptr[0x227])((ulong)(uint)g_AttribLocationProjMtx,1,0);
  (*gl3wProcs.ptr[0x14])(0,0);
  (*gl3wProcs.ptr[0x1a])((ulong)vertex_array_object);
  (*gl3wProcs.ptr[8])(0x8892,(ulong)g_VboHandle);
  (*gl3wProcs.ptr[8])(0x8893,(ulong)g_ElementsHandle);
  (*gl3wProcs.ptr[0x98])((ulong)(uint)g_AttribLocationVtxPos);
  (*gl3wProcs.ptr[0x98])((ulong)(uint)g_AttribLocationVtxUV);
  (*gl3wProcs.ptr[0x98])((ulong)(uint)g_AttribLocationVtxColor);
  (*gl3wProcs.ptr[0x28a])((ulong)(uint)g_AttribLocationVtxPos,2,0x1406,0,0x14,0);
  (*gl3wProcs.ptr[0x28a])((ulong)(uint)g_AttribLocationVtxUV,2,0x1406,0,0x14,8);
  (*gl3wProcs.ptr[0x28a])((ulong)(uint)g_AttribLocationVtxColor,4,0x1401,1,0x14,0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
    glEnableVertexAttribArray(g_AttribLocationVtxPos);
    glEnableVertexAttribArray(g_AttribLocationVtxUV);
    glEnableVertexAttribArray(g_AttribLocationVtxColor);
    glVertexAttribPointer(g_AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE,  sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));
}